

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_stale_simple_keys(yaml_parser_t *parser)

{
  yaml_simple_key_t *pyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  yaml_simple_key_t *pyVar5;
  
  pyVar5 = (parser->simple_keys).start;
  pyVar1 = (parser->simple_keys).top;
  do {
    if (pyVar5 == pyVar1) {
      return 1;
    }
    if ((pyVar5->possible != 0) &&
       (((pyVar5->mark).line < (parser->mark).line ||
        ((pyVar5->mark).index + 0x400 < (parser->mark).index)))) {
      if (pyVar5->required != 0) {
        sVar2 = (pyVar5->mark).column;
        sVar3 = (pyVar5->mark).index;
        sVar4 = (pyVar5->mark).line;
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a simple key";
        (parser->context_mark).index = sVar3;
        (parser->context_mark).line = sVar4;
        (parser->context_mark).column = sVar2;
        parser->problem = "could not find expected \':\'";
        sVar2 = (parser->mark).line;
        (parser->problem_mark).index = (parser->mark).index;
        (parser->problem_mark).line = sVar2;
        (parser->problem_mark).column = (parser->mark).column;
        return 0;
      }
      pyVar5->possible = 0;
    }
    pyVar5 = pyVar5 + 1;
  } while( true );
}

Assistant:

static int
yaml_parser_stale_simple_keys(yaml_parser_t *parser)
{
    yaml_simple_key_t *simple_key;

    /* Check for a potential simple key for each flow level. */

    for (simple_key = parser->simple_keys.start;
            simple_key != parser->simple_keys.top; simple_key ++)
    {
        /*
         * The specification requires that a simple key
         *
         *  - is limited to a single line,
         *  - is shorter than 1024 characters.
         */

        if (simple_key->possible
                && (simple_key->mark.line < parser->mark.line
                    || simple_key->mark.index+1024 < parser->mark.index)) {

            /* Check if the potential simple key to be removed is required. */

            if (simple_key->required) {
                return yaml_parser_set_scanner_error(parser,
                        "while scanning a simple key", simple_key->mark,
                        "could not find expected ':'");
            }

            simple_key->possible = 0;
        }
    }

    return 1;
}